

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O3

void nlohmann::detail::
     from_json<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
               (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                *j,boolean_t *b)

{
  type_error *__return_storage_ptr__;
  char *__s;
  size_t sVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  if (j->m_type == boolean) {
    *b = (j->m_value).boolean;
    return;
  }
  __return_storage_ptr__ = (type_error *)__cxa_allocate_exception(0x20);
  __s = basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        ::type_name(j);
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  sVar1 = strlen(__s);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,__s,__s + sVar1);
  std::operator+(&local_68,"type must be boolean, but is ",&local_48);
  type_error::create(__return_storage_ptr__,0x12e,&local_68);
  __cxa_throw(__return_storage_ptr__,&type_error::typeinfo,exception::~exception);
}

Assistant:

void from_json(const BasicJsonType& j, typename BasicJsonType::boolean_t& b)
{
    if (JSON_HEDLEY_UNLIKELY(!j.is_boolean()))
    {
        JSON_THROW(type_error::create(302, "type must be boolean, but is " + std::string(j.type_name())));
    }
    b = *j.template get_ptr<const typename BasicJsonType::boolean_t*>();
}